

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setting.h
# Opt level: O2

void __thiscall YAML::SettingChanges::clear(SettingChanges *this)

{
  restore(this);
  std::
  vector<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
  ::clear(&this->m_settingChanges);
  return;
}

Assistant:

void clear() YAML_CPP_NOEXCEPT {
    restore();
    m_settingChanges.clear();
  }